

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_intmin_max(ASMState *as,IRIns *ir,int cc)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  Reg dest;
  MCode *pMVar5;
  uint uVar6;
  Reg r2;
  uint uVar7;
  uint local_34;
  
  dest = ra_dest(as,ir,0xffef);
  uVar2 = (ir->field_0).op1;
  uVar3 = (ir->field_0).op2;
  uVar6 = (uint)uVar3;
  if (-1 < (short)uVar3) {
    uVar6 = (uint)uVar2;
  }
  cVar1 = *(char *)((long)as->ir + (ulong)uVar6 * 8 + 6);
  r2 = (Reg)cVar1;
  if (cVar1 < '\0') {
    r2 = ra_allocref(as,uVar6,~(1 << (dest & 0x1f)) & 0xffef);
  }
  bVar4 = (byte)r2 & 0x1f;
  as->weakset = as->weakset & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
  uVar6._0_2_ = *(IROpT *)((long)ir + 4);
  uVar6._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rr(as,cc * 0x1000000 + XO_CMOV,
          -(uint)((0x604208U >> (uVar6 & 0x1f) & 1) != 0) & 0x80200 | dest,r2);
  uVar7._0_2_ = *(IROpT *)((long)ir + 4);
  uVar7._2_2_ = *(IRRef1 *)((long)ir + 6);
  uVar6 = -(uint)((0x604208U >> (uVar7 & 0x1f) & 1) != 0) & 0x80200;
  pMVar5 = as->mcp;
  pMVar5[-1] = ((byte)r2 & 7) + (char)dest * '\b' | 0xc0;
  pMVar5[-2] = ';';
  uVar7 = r2 >> 3 & 1 | (uVar6 | dest) >> 1 & 0x104;
  if (uVar7 == 0) {
    pMVar5 = pMVar5 + -2;
  }
  else {
    pMVar5[-3] = (byte)uVar7 | (byte)(uVar6 >> 0x10) | 0x40;
    pMVar5 = pMVar5 + -3;
  }
  local_34 = (uint)uVar2;
  if (-1 < (short)uVar3) {
    local_34 = (uint)uVar3;
  }
  as->mcp = pMVar5;
  ra_left(as,dest,local_34);
  return;
}

Assistant:

static void asm_intmin_max(ASMState *as, IRIns *ir, int cc)
{
  Reg right, dest = ra_dest(as, ir, RSET_GPR);
  IRRef lref = ir->op1, rref = ir->op2;
  if (irref_isk(rref)) { lref = rref; rref = ir->op1; }
  right = ra_alloc1(as, rref, rset_exclude(RSET_GPR, dest));
  emit_rr(as, XO_CMOV + (cc<<24), REX_64IR(ir, dest), right);
  emit_rr(as, XO_CMP, REX_64IR(ir, dest), right);
  ra_left(as, dest, lref);
}